

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O3

_Bool borg_read_unknown(void)

{
  _Bool _Var1;
  char *what;
  _Bool *p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  if ((ulong)z_info->pack_size != 0) {
    p_Var2 = &borg_items->aware;
    uVar4 = 0xffffffff;
    uVar3 = 0;
    do {
      if (((p_Var2[6] != false) && (p_Var2[2] == true)) && (*p_Var2 == false)) {
        uVar4 = uVar3 & 0xffffffff;
      }
      uVar3 = uVar3 + 1;
      p_Var2 = p_Var2 + 0x388;
    } while (z_info->pack_size != uVar3);
    if (((-1 < (int)uVar4) && (_Var1 = no_light(player), !_Var1)) &&
       ((borg.trait[0x70] == 0 && (borg.trait[0x72] == 0)))) {
      what = format("# Reading unknown scroll %s.",borg_items + uVar4);
      borg_note(what);
      borg_keypress(0x72);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar4]);
      borg_keypress(0xe000);
      borg.goal.shop = -1;
      borg.goal.ware = -1;
      borg.goal.item = -1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_read_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_SCROLL)
            continue;

        /* Skip aware items */
        if (item->aware)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return false;

    /* Dark */
    if (no_light(player))
        return false;

    /* Blind or Confused */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return false;

    /* Log the message */
    borg_note(format("# Reading unknown scroll %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('r');
    borg_keypress(all_letters_nohjkl[n]);

    /* Incase it is ID scroll, ESCAPE out. */
    borg_keypress(ESCAPE);

    /* Hack -- Clear "shop" goals */
    borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

    /* Success */
    return true;
}